

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<unsigned_char>_> * __thiscall
kj::decodeBinaryUriComponent
          (EncodingResult<kj::Array<unsigned_char>_> *__return_storage_ptr__,kj *this,
          ArrayPtr<const_char> text,DecodeUriOptions options)

{
  kj *params;
  int iVar1;
  EncodingResult<kj::Array<unsigned_char>_> *pEVar2;
  byte bVar3;
  byte bVar4;
  char *count;
  kj *pkVar5;
  kj *pkVar6;
  byte b;
  Vector<unsigned_char> result;
  byte local_7a;
  byte local_79;
  Array<unsigned_char> local_78;
  EncodingResult<kj::Array<unsigned_char>_> *local_58;
  ArrayBuilder<unsigned_char> local_50;
  
  count = text.ptr + ((uint)text.size_ & 1);
  local_58 = __return_storage_ptr__;
  local_50.ptr = _::HeapArrayDisposer::allocateUninitialized<unsigned_char>((size_t)count);
  local_50.endPtr = (uchar *)(count + (long)local_50.ptr);
  local_50.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pkVar6 = (kj *)(text.ptr + (long)this);
  bVar4 = 0;
  local_50.pos = local_50.ptr;
  do {
    do {
      do {
        bVar3 = bVar4;
        params = this;
        while( true ) {
          pkVar5 = params + 1;
          if (pkVar6 <= params) {
            if (((undefined1  [16])text & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_78.ptr = (uchar *)((ulong)local_78.ptr & 0xffffffff00000000);
              Vector<unsigned_char>::add<int>((Vector<unsigned_char> *)&local_50,(int *)&local_78);
            }
            Vector<unsigned_char>::releaseAsArray(&local_78,(Vector<unsigned_char> *)&local_50);
            pEVar2 = local_58;
            (local_58->super_Array<unsigned_char>).ptr = local_78.ptr;
            (local_58->super_Array<unsigned_char>).size_ = local_78.size_;
            (local_58->super_Array<unsigned_char>).disposer = local_78.disposer;
            local_78.ptr = (uchar *)0x0;
            local_78.size_ = 0;
            local_58->hadErrors = (bool)(bVar3 & 1);
            Array<unsigned_char>::~Array(&local_78);
            ArrayBuilder<unsigned_char>::dispose(&local_50);
            return pEVar2;
          }
          if (*params == (kj)0x25) break;
          if ((((uint)text.size_ >> 8 & 1) == 0) || (*params != (kj)0x2b)) {
            Vector<unsigned_char>::add<char_const&>
                      ((Vector<unsigned_char> *)&local_50,(char *)params);
            params = pkVar5;
          }
          else {
            local_78.ptr = (uchar *)CONCAT71(local_78.ptr._1_7_,0x20);
            Vector<unsigned_char>::add<char>((Vector<unsigned_char> *)&local_50,(char *)&local_78);
            params = pkVar5;
          }
        }
        this = pkVar6;
        bVar4 = 1;
        local_79 = bVar3;
      } while (pkVar5 == pkVar6);
      anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&local_78,(char)*pkVar5);
      this = pkVar5;
    } while ((char)local_78.ptr != '\x01');
    iVar1 = local_78.ptr._4_4_;
    local_7a = (byte)((ulong)local_78.ptr >> 0x20);
    pkVar5 = params + 2;
    this = pkVar6;
    if (pkVar5 == pkVar6) {
LAB_003adeb6:
      bVar4 = 1;
    }
    else {
      anon_unknown_0::tryFromHexDigit((anon_unknown_0 *)&local_78,(char)*pkVar5);
      this = pkVar5;
      if ((char)local_78.ptr != '\x01') goto LAB_003adeb6;
      local_7a = (byte)(iVar1 << 4) | (byte)((ulong)local_78.ptr >> 0x20);
      this = params + 3;
      bVar4 = local_79;
    }
    Vector<unsigned_char>::add<unsigned_char&>((Vector<unsigned_char> *)&local_50,&local_7a);
  } while( true );
}

Assistant:

EncodingResult<Array<byte>> decodeBinaryUriComponent(
    ArrayPtr<const char> text, DecodeUriOptions options) {
  Vector<byte> result(text.size() + options.nulTerminate);
  bool hadErrors = false;

  const char* ptr = text.begin();
  const char* end = text.end();
  while (ptr < end) {
    if (*ptr == '%') {
      ++ptr;

      if (ptr == end) {
        hadErrors = true;
      } else KJ_IF_SOME(d1, tryFromHexDigit(*ptr)) {
        byte b = d1;
        ++ptr;
        if (ptr == end) {
          hadErrors = true;
        } else KJ_IF_SOME(d2, tryFromHexDigit(*ptr)) {
          b = (b << 4) | d2;
          ++ptr;
        } else {
          hadErrors = true;
        }
        result.add(b);
      } else {
        hadErrors = true;
      }
    } else if (options.plusToSpace && *ptr == '+') {
      ++ptr;
      result.add(' ');
    } else {
      result.add(*ptr++);
    }
  }